

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_tostring.hpp
# Opt level: O0

string * Catch::Detail::
         rangeToString<(anonymous_namespace)::Constructable_const*,(anonymous_namespace)::Constructable_const*>
                   (Constructable *first,Constructable *last)

{
  long in_RDX;
  long in_RSI;
  string *in_RDI;
  ReusableStringStream rss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  string *this;
  ReusableStringStream *in_stack_ffffffffffffffb0;
  undefined8 local_10;
  
  this = in_RDI;
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)in_RDI);
  ReusableStringStream::operator<<
            ((ReusableStringStream *)this,(char (*) [3])in_stack_ffffffffffffff68);
  if (in_RSI != in_RDX) {
    stringify<(anonymous_namespace)::Constructable>((Constructable *)in_stack_ffffffffffffff68);
    ReusableStringStream::operator<<((ReusableStringStream *)this,in_stack_ffffffffffffff68);
    std::__cxx11::string::~string(this);
    while (local_10 = in_RSI + 8, local_10 != in_RDX) {
      in_stack_ffffffffffffff68 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ReusableStringStream::operator<<
                     ((ReusableStringStream *)this,(char (*) [3])in_stack_ffffffffffffff68);
      stringify<(anonymous_namespace)::Constructable>((Constructable *)in_stack_ffffffffffffff68);
      ReusableStringStream::operator<<((ReusableStringStream *)this,in_stack_ffffffffffffff68);
      std::__cxx11::string::~string(this);
      in_RSI = local_10;
    }
  }
  ReusableStringStream::operator<<
            ((ReusableStringStream *)this,(char (*) [3])in_stack_ffffffffffffff68);
  ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_ffffffffffffff68);
  ReusableStringStream::~ReusableStringStream(in_stack_ffffffffffffffb0);
  return in_RDI;
}

Assistant:

std::string rangeToString(InputIterator first, Sentinel last) {
            ReusableStringStream rss;
            rss << "{ ";
            if (first != last) {
                rss << ::Catch::Detail::stringify(*first);
                for (++first; first != last; ++first)
                    rss << ", " << ::Catch::Detail::stringify(*first);
            }
            rss << " }";
            return rss.str();
        }